

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O1

void __thiscall CTables::calcInterpolationTableInt(CTables *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  interpItemInt **ppiVar4;
  interpItemInt *piVar5;
  ostream *poVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  
  iVar2 = this->cellSize;
  uVar10 = (long)iVar2 * 8;
  if ((long)iVar2 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  ppiVar4 = (interpItemInt **)operator_new__(uVar10);
  this->interpolationTableInt = ppiVar4;
  uVar13 = -(iVar2 / 2);
  iVar2 = this->cellSize;
  iVar15 = iVar2 / 2;
  if ((int)uVar13 < iVar15) {
    uVar8 = ~uVar13;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar2;
      uVar10 = SUB168(auVar1 * ZEXT816(0x30),0);
      if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar5 = (interpItemInt *)operator_new__(uVar10);
      this->interpolationTableInt[(int)(iVar15 + uVar13)] = piVar5;
      iVar2 = iVar2 / 2;
      iVar3 = -iVar2;
      iVar15 = this->cellSize;
      iVar14 = iVar15 / 2;
      if (iVar3 < iVar14) {
        ppiVar4 = this->interpolationTableInt;
        uVar7 = ~uVar13;
        lVar11 = (long)iVar3;
        iVar3 = iVar3 * uVar8;
        do {
          uVar9 = (uint)lVar11;
          if ((int)(uVar9 & uVar13) < 0) {
            iVar12 = iVar15 + uVar9 + 1;
            iVar15 = uVar13 + 1 + iVar15;
            ppiVar4[(int)(iVar14 + uVar13)][(int)(iVar14 + uVar9)].displace[0][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[0][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[0] = iVar12 * iVar15;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][1] = -1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[1] = iVar12 * uVar7;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][0] = -1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[2] = (iVar2 + -1) * iVar15;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][1] = -1;
            iVar15 = (-1 - uVar9) * uVar7;
          }
          else if (((int)uVar13 < 0) && (-1 < (int)uVar9)) {
            iVar12 = uVar13 + 1 + iVar15;
            ppiVar4[(int)(iVar14 + uVar13)][(int)(iVar14 + uVar9)].displace[0][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[0][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[0] =
                 (iVar15 + iVar2) * iVar12;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][1] = -1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[1] =
                 (iVar15 + iVar2) * uVar7;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[2][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[2][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].weightRatio[2] = iVar12 * uVar9;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][1] = -1;
            iVar15 = iVar3;
          }
          else if ((int)(uVar9 | uVar13) < 0) {
            if (((int)uVar13 < 0) || (-1 < (int)uVar9)) {
              poVar6 = std::operator<<((ostream *)&std::cout,"err");
              std::endl<char,std::char_traits<char>>(poVar6);
              exit(0);
            }
            iVar12 = iVar15 + uVar9 + 1;
            ppiVar4[(int)(iVar14 + uVar13)][(int)(iVar14 + uVar9)].displace[0][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[0][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[0] =
                 iVar12 * (iVar15 - uVar13);
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][1] = 1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[1] = iVar12 * uVar13;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][0] = -1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[2] =
                 (iVar15 - uVar13) * (iVar2 + -1);
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][1] = 1;
            iVar15 = (-1 - uVar9) * uVar13;
          }
          else {
            ppiVar4[(int)(iVar14 + uVar13)][(int)(iVar14 + uVar9)].displace[0][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[0][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[0] =
                 (iVar15 + iVar2) * (iVar15 - uVar13);
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][0] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[1][1] = 1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[1] =
                 (iVar15 + iVar2) * uVar13;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][0] = 1;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].displace[2][1] = 0;
            iVar14 = this->cellSize / 2;
            ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[2] =
                 (iVar15 - uVar13) * uVar9;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar4[(int)(iVar15 + uVar13)][iVar15 + lVar11].displace[3][1] = 1;
            iVar15 = uVar9 * uVar13;
          }
          iVar14 = this->cellSize / 2;
          ppiVar4[(int)(iVar14 + uVar13)][iVar14 + lVar11].weightRatio[3] = iVar15;
          lVar11 = lVar11 + 1;
          iVar15 = this->cellSize;
          iVar14 = iVar15 / 2;
          iVar3 = iVar3 + uVar8;
          iVar2 = iVar2 + -1;
        } while ((int)lVar11 < iVar14);
      }
      uVar13 = uVar13 + 1;
      iVar2 = this->cellSize;
      iVar15 = iVar2 / 2;
      uVar8 = uVar8 - 1;
    } while ((int)uVar13 < iVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"interTable created",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void CTables::calcInterpolationTableInt()
{
    interpolationTableInt = new interpItemInt*[cellSize];
    for(int y=-cellSize/2; y<cellSize/2; y++)
    {
        interpolationTableInt[y+cellSize/2] = new interpItemInt[cellSize];
        for(int x=-cellSize/2; x<cellSize/2; x++)
        {
            if(y<0 && x <0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y<0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x<0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else
            {
                cout<<"err"<<endl;
                exit(0);
            }
        }
    }
    cout<<"interTable created"<<endl;
}